

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O0

optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *
DecodeBase64(string_view str)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_iterator pvVar4;
  const_iterator pvVar5;
  optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *in_RDI;
  long in_FS_OFFSET;
  bool valid;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ret;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff70;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff78;
  optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *this;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined1 local_30 [24];
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_stack_ffffffffffffff68);
  if ((sVar2 & 3) == 0) {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_stack_ffffffffffffff68);
    if (sVar2 != 0) {
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::back
                         (in_stack_ffffffffffffff78);
      if (*pvVar3 == '=') {
        std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix
                  (in_stack_ffffffffffffff68,0x1abcae);
      }
    }
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_stack_ffffffffffffff68);
    if (sVar2 != 0) {
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::back
                         (in_stack_ffffffffffffff78);
      if (*pvVar3 == '=') {
        std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix
                  (in_stack_ffffffffffffff68,0x1abce8);
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff68);
    std::basic_string_view<char,_std::char_traits<char>_>::size(in_stack_ffffffffffffff68);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),(size_type)in_RDI);
    this = (optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
           &stack0xffffffffffffffe8;
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::begin(in_stack_ffffffffffffff68)
    ;
    pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::end(in_stack_ffffffffffffff68);
    bVar1 = ConvertBits<6,8,false,DecodeBase64(std::basic_string_view<char,std::char_traits<char>>)::__0,char_const*,DecodeBase64(std::basic_string_view<char,std::char_traits<char>>)::__1>
                      (local_30,pvVar4,pvVar5);
    if (bVar1) {
      std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
      optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true>
                (this,in_stack_ffffffffffffff70);
    }
    else {
      std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::optional
                ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                 in_stack_ffffffffffffff68);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  }
  else {
    std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::optional
              ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_ffffffffffffff68);
  }
  if (*(pointer *)(in_FS_OFFSET + 0x28) == (pointer)local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::vector<unsigned char>> DecodeBase64(std::string_view str)
{
    static const int8_t decode64_table[256]{
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, 62, -1, -1, -1, 63, 52, 53, 54, 55, 56, 57, 58, 59, 60, 61, -1, -1,
        -1, -1, -1, -1, -1,  0,  1,  2,  3,  4,  5,  6,  7,  8,  9, 10, 11, 12, 13, 14,
        15, 16, 17, 18, 19, 20, 21, 22, 23, 24, 25, -1, -1, -1, -1, -1, -1, 26, 27, 28,
        29, 30, 31, 32, 33, 34, 35, 36, 37, 38, 39, 40, 41, 42, 43, 44, 45, 46, 47, 48,
        49, 50, 51, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1
    };

    if (str.size() % 4 != 0) return {};
    /* One or two = characters at the end are permitted. */
    if (str.size() >= 1 && str.back() == '=') str.remove_suffix(1);
    if (str.size() >= 1 && str.back() == '=') str.remove_suffix(1);

    std::vector<unsigned char> ret;
    ret.reserve((str.size() * 3) / 4);
    bool valid = ConvertBits<6, 8, false>(
        [&](unsigned char c) { ret.push_back(c); },
        str.begin(), str.end(),
        [](char c) { return decode64_table[uint8_t(c)]; }
    );
    if (!valid) return {};

    return ret;
}